

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O3

void __thiscall
JsonNumber_Uint64Max_Test::~JsonNumber_Uint64Max_Test(JsonNumber_Uint64Max_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonNumber).super_Test._vptr_Test = (_func_int **)&PTR__JsonNumber_001bec88;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonNumber).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonNumber, Uint64Max) {
    PSTORE_ASSERT (uint64_max_str == std::to_string (uint64_max) &&
                   "The hard-wired unsigned 64-bit max string seems to be incorrect");
    EXPECT_CALL (callbacks_, uint64_value (uint64_max)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{uint64_max_str}).eof ();
    EXPECT_FALSE (p.has_error ());
}